

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzHalfMod(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = *a;
  uVar1 = -(ulong)((uint)uVar2 & 1);
  uVar4 = *mod & uVar1;
  bVar7 = CARRY8(uVar4,uVar2);
  *b = uVar4 + uVar2 >> 1;
  for (uVar2 = 1; uVar2 < n; uVar2 = uVar2 + 1) {
    uVar4 = a[uVar2];
    uVar3 = (ulong)bVar7 + a[uVar2];
    b[uVar2] = uVar3;
    uVar5 = mod[uVar2] & uVar1;
    uVar6 = uVar5 + uVar3;
    b[uVar2 - 1] = b[uVar2 - 1] | uVar6 << 0x3f;
    bVar7 = CARRY8(uVar5,uVar3) || CARRY8((ulong)bVar7,uVar4);
    b[uVar2] = uVar6 >> 1;
  }
  b[n - 1] = b[n - 1] | (ulong)bVar7 << 0x3f;
  return;
}

Assistant:

void SAFE(zzHalfMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word mask = 0;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(mod, b, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// mask <- (a -- нечетное) ? WORD_MAX : WORD_0
	mask = WORD_0 - (a[0] & WORD_1);
	// b <- (a + mod & mask) / 2 [(a -- нечетное) ? (a + mod) / 2 : a / 2]
	w = mask & mod[0];
	b[0] = a[0] + w;
	carry = wordLess01(b[0], w);
	b[0] >>= 1;
	for(i = 1; i < n; ++i)
	{
		b[i] = a[i];
		b[i] += carry;
		carry = wordLess01(b[i], carry);
		w = mask & mod[i];
		b[i] += w;
		carry |= wordLess01(b[i], w);
		b[i - 1] |= (b[i] & WORD_1) << (B_PER_W - 1);
		b[i] >>= 1;
	}
	b[n - 1] |= carry << (B_PER_W - 1);
	// очистка
	carry = mask = w = 0;
}